

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQFunctionScopeForStage.cpp
# Opt level: O0

void __thiscall
FactoredQFunctionScopeForStage::RemoveLocalQ(FactoredQFunctionScopeForStage *this,Index j)

{
  const_iterator __position;
  Scope *pSVar1;
  undefined8 uVar2;
  uint in_ESI;
  vector<Scope,_std::allocator<Scope>_> *in_RDI;
  vector<Scope,_std::allocator<Scope>_> *in_stack_ffffffffffffff78;
  vector<Scope,_std::allocator<Scope>_> *this_00;
  __normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *in_stack_ffffffffffffff88
  ;
  char *in_stack_ffffffffffffffa8;
  E *in_stack_ffffffffffffffb0;
  
  __position._M_current = (Scope *)(ulong)in_ESI;
  pSVar1 = (Scope *)std::vector<Scope,_std::allocator<Scope>_>::size(in_RDI + 1);
  if (pSVar1 <= __position._M_current) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  this_00 = in_RDI + 1;
  std::vector<Scope,_std::allocator<Scope>_>::begin(in_stack_ffffffffffffff78);
  __gnu_cxx::__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>::operator+
            (in_stack_ffffffffffffff88,(difference_type)this_00);
  __gnu_cxx::__normal_iterator<Scope_const*,std::vector<Scope,std::allocator<Scope>>>::
  __normal_iterator<Scope*>
            ((__normal_iterator<const_Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *)
             this_00,(__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *)
                     in_stack_ffffffffffffff78);
  std::vector<Scope,_std::allocator<Scope>_>::erase(in_RDI,__position);
  std::vector<Scope,_std::allocator<Scope>_>::begin(in_stack_ffffffffffffff78);
  __gnu_cxx::__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>::operator+
            (in_stack_ffffffffffffff88,(difference_type)this_00);
  __gnu_cxx::__normal_iterator<Scope_const*,std::vector<Scope,std::allocator<Scope>>>::
  __normal_iterator<Scope*>
            ((__normal_iterator<const_Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *)
             this_00,(__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *)
                     in_stack_ffffffffffffff78);
  std::vector<Scope,_std::allocator<Scope>_>::erase(in_RDI,__position);
  return;
}

Assistant:

void 
FactoredQFunctionScopeForStage::RemoveLocalQ( Index j)
{
    if(j >= _m_sfacScopes.size())
        throw E("FactoredQFunctionScopeForStage::RemoveLocalQ( Index j), index j out of bounds");

    _m_sfacScopes.erase(_m_sfacScopes.begin() + j );
    _m_agentScopes.erase(_m_agentScopes.begin() + j );
}